

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temporal_filter.c
# Opt level: O0

void init_tf_ctx(AV1_COMP *cpi,int filter_frame_lookahead_idx,int gf_frame_index,
                int compute_frame_diff,YV12_BUFFER_CONFIG *output_frame)

{
  YV12_BUFFER_CONFIG *frame;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_ECX;
  long in_RDI;
  undefined8 in_R8;
  int subsampling_y;
  int subsampling_x;
  int i;
  int num_pels;
  int num_planes;
  int is_highbitdepth;
  int mb_pels;
  int mb_cols;
  int mb_rows;
  int mb_height;
  int mb_width;
  int frame_width;
  int frame_height;
  BLOCK_SIZE block_size;
  YV12_BUFFER_CONFIG *frame_to_filter;
  int filter_frame_idx;
  MACROBLOCKD *mbd;
  scale_factors *sf;
  YV12_BUFFER_CONFIG **frames;
  TemporalFilterCtx *tf_ctx;
  int in_stack_000000d8;
  int in_stack_000000dc;
  AV1_COMP *in_stack_000000e0;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  int iVar5;
  undefined4 in_stack_ffffffffffffff84;
  int iVar6;
  
  *(undefined4 *)(in_RDI + 0x42bd0) = 0;
  *(undefined4 *)(in_RDI + 0x42be0) = 0xffffffff;
  *(undefined8 *)(in_RDI + 0x42bd8) = in_R8;
  *(undefined4 *)(in_RDI + 0x42be4) = in_ECX;
  tf_setup_filtering_buffer(in_stack_000000e0,in_stack_000000dc,in_stack_000000d8);
  av1_setup_scale_factors_for_frame
            ((scale_factors *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
             in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,0,0x31a897);
  frame = *(YV12_BUFFER_CONFIG **)(in_RDI + 0x42a50 + (long)*(int *)(in_RDI + 0x42be0) * 8);
  iVar2 = (frame->field_2).field_0.y_crop_width;
  iVar1 = get_num_blocks((frame->field_3).field_0.y_crop_height,0x20);
  iVar2 = get_num_blocks(iVar2,0x20);
  iVar3 = is_frame_high_bitdepth(frame);
  iVar4 = av1_num_planes((AV1_COMMON *)(in_RDI + 0x3bf80));
  iVar6 = 0;
  for (iVar5 = 0; iVar5 < iVar4; iVar5 = iVar5 + 1) {
    iVar6 = (0x400 >> ((char)*(undefined4 *)(in_RDI + 0x151d0 + (long)iVar5 * 0xa30 + 0x14) +
                       (char)*(undefined4 *)(in_RDI + 0x151d0 + (long)iVar5 * 0xa30 + 0x18) & 0x1fU)
            ) + iVar6;
  }
  *(int *)(in_RDI + 0x42c10) = iVar6;
  *(int *)(in_RDI + 0x42c14) = iVar1;
  *(int *)(in_RDI + 0x42c18) = iVar2;
  *(int *)(in_RDI + 0x42c1c) = iVar3;
  iVar2 = get_q((AV1_COMP *)CONCAT44(iVar6,iVar5));
  *(int *)(in_RDI + 0x42c20) = iVar2;
  return;
}

Assistant:

static void init_tf_ctx(AV1_COMP *cpi, int filter_frame_lookahead_idx,
                        int gf_frame_index, int compute_frame_diff,
                        YV12_BUFFER_CONFIG *output_frame) {
  TemporalFilterCtx *tf_ctx = &cpi->tf_ctx;
  // Setup frame buffer for filtering.
  YV12_BUFFER_CONFIG **frames = tf_ctx->frames;
  tf_ctx->num_frames = 0;
  tf_ctx->filter_frame_idx = -1;
  tf_ctx->output_frame = output_frame;
  tf_ctx->compute_frame_diff = compute_frame_diff;
  tf_setup_filtering_buffer(cpi, filter_frame_lookahead_idx, gf_frame_index);
  assert(tf_ctx->num_frames > 0);
  assert(tf_ctx->filter_frame_idx < tf_ctx->num_frames);

  // Setup scaling factors. Scaling on each of the arnr frames is not
  // supported.
  // ARF is produced at the native frame size and resized when coded.
  struct scale_factors *sf = &tf_ctx->sf;
  av1_setup_scale_factors_for_frame(
      sf, frames[0]->y_crop_width, frames[0]->y_crop_height,
      frames[0]->y_crop_width, frames[0]->y_crop_height);

  // Initialize temporal filter parameters.
  MACROBLOCKD *mbd = &cpi->td.mb.e_mbd;
  const int filter_frame_idx = tf_ctx->filter_frame_idx;
  const YV12_BUFFER_CONFIG *const frame_to_filter = frames[filter_frame_idx];
  const BLOCK_SIZE block_size = TF_BLOCK_SIZE;
  const int frame_height = frame_to_filter->y_crop_height;
  const int frame_width = frame_to_filter->y_crop_width;
  const int mb_width = block_size_wide[block_size];
  const int mb_height = block_size_high[block_size];
  const int mb_rows = get_num_blocks(frame_height, mb_height);
  const int mb_cols = get_num_blocks(frame_width, mb_width);
  const int mb_pels = mb_width * mb_height;
  const int is_highbitdepth = is_frame_high_bitdepth(frame_to_filter);
  const int num_planes = av1_num_planes(&cpi->common);
  int num_pels = 0;
  for (int i = 0; i < num_planes; i++) {
    const int subsampling_x = mbd->plane[i].subsampling_x;
    const int subsampling_y = mbd->plane[i].subsampling_y;
    num_pels += mb_pels >> (subsampling_x + subsampling_y);
  }
  tf_ctx->num_pels = num_pels;
  tf_ctx->mb_rows = mb_rows;
  tf_ctx->mb_cols = mb_cols;
  tf_ctx->is_highbitdepth = is_highbitdepth;
  tf_ctx->q_factor = get_q(cpi);
}